

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O2

shared_ptr<mocker::nasm::Addr> __thiscall
mocker::nasm::replaceRegs
          (nasm *this,shared_ptr<mocker::nasm::Addr> *addr,RegMap<std::shared_ptr<Register>_> *mp)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  shared_ptr<mocker::nasm::Addr> sVar3;
  shared_ptr<mocker::nasm::Register> p;
  shared_ptr<mocker::nasm::Register> reg1;
  shared_ptr<mocker::nasm::Register> reg2;
  anon_class_8_1_3fcf6661 getIfExists;
  shared_ptr<mocker::nasm::Addr> local_78;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_68;
  __shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> local_50;
  undefined1 local_40 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  undefined4 local_20;
  int local_1c;
  
  local_40._0_8_ = mp;
  std::dynamic_pointer_cast<mocker::nasm::NumericConstant,mocker::nasm::Addr>(&local_78);
  if (local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    std::dynamic_pointer_cast<mocker::nasm::LabelAddr,mocker::nasm::Addr>
              ((shared_ptr<mocker::nasm::Addr> *)&local_68);
    if (local_68._M_ptr != (element_type *)0x0) {
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      goto LAB_0018f57f;
    }
    std::dynamic_pointer_cast<mocker::nasm::Label,mocker::nasm::Addr>
              ((shared_ptr<mocker::nasm::Addr> *)&local_50);
    peVar1 = local_50._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    if (peVar1 == (element_type *)0x0) {
      std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Addr>(&local_78);
      if (local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
        std::dynamic_pointer_cast<mocker::nasm::MemoryAddr,mocker::nasm::Addr>(&local_78);
        if (local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/nasm/src/helper.cpp"
                        ,0xb3,
                        "std::shared_ptr<Addr> mocker::nasm::replaceRegs(const std::shared_ptr<Addr> &, const RegMap<std::shared_ptr<Register>> &)"
                       );
        }
        std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Register>
                  ((shared_ptr<mocker::nasm::Register> *)&local_68);
        if (local_68._M_ptr == (element_type *)0x0) {
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_50,
                     (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 1));
        }
        else {
          replaceRegs::anon_class_8_1_3fcf6661::operator()
                    ((anon_class_8_1_3fcf6661 *)&local_50,
                     (shared_ptr<mocker::nasm::Register> *)local_40);
        }
        std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_68,&local_50);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
        std::dynamic_pointer_cast<mocker::nasm::Register,mocker::nasm::Register>
                  ((shared_ptr<mocker::nasm::Register> *)&local_50);
        if (local_50._M_ptr == (element_type *)0x0) {
          std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_40 + 8),
                     (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                     (local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr + 3));
        }
        else {
          replaceRegs::anon_class_8_1_3fcf6661::operator()
                    ((anon_class_8_1_3fcf6661 *)(local_40 + 8),
                     (shared_ptr<mocker::nasm::Register> *)local_40);
        }
        std::__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_50,
                   (__shared_ptr<mocker::nasm::Register,_(__gnu_cxx::_Lock_policy)2> *)
                   (local_40 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
        local_1c = *(int *)&local_78.
                            super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr[5]._vptr_Addr;
        local_20 = *(undefined4 *)
                    &local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr[6]._vptr_Addr;
        std::
        make_shared<mocker::nasm::MemoryAddr,std::shared_ptr<mocker::nasm::Register>&,std::shared_ptr<mocker::nasm::Register>&,int,int>
                  ((shared_ptr<mocker::nasm::Register> *)(local_40 + 8),
                   (shared_ptr<mocker::nasm::Register> *)&local_68,(int *)&local_50,&local_1c);
        _Var2._M_pi = a_Stack_30[0]._M_pi;
        a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(undefined8 *)this = local_40._8_8_;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
        local_40._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_30);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
      }
      else {
        replaceRegs::anon_class_8_1_3fcf6661::operator()
                  ((anon_class_8_1_3fcf6661 *)&local_68,
                   (shared_ptr<mocker::nasm::Register> *)local_40);
        _Var2._M_pi = local_68._M_refcount._M_pi;
        local_68._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        *(element_type **)this = local_68._M_ptr;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var2._M_pi;
        local_68._M_ptr = (element_type *)0x0;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      _Var2._M_pi = extraout_RDX_00;
      goto LAB_0018f594;
    }
  }
  else {
LAB_0018f57f:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_78.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
  }
  std::__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2> *)this,
             &addr->super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>);
  _Var2._M_pi = extraout_RDX;
LAB_0018f594:
  sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::nasm::Addr>)
         sVar3.super___shared_ptr<mocker::nasm::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr> replaceRegs(const std::shared_ptr<Addr> &addr,
                                  const RegMap<std::shared_ptr<Register>> &mp) {
  auto getIfExists = [&mp](const std::shared_ptr<Register> &p) {
    auto iter = mp.find(p);
    if (iter == mp.end())
      return p;
    return iter->second;
  };
  if (dyc<NumericConstant>(addr) || dyc<LabelAddr>(addr) || dyc<Label>(addr))
    return addr;
  if (auto p = dyc<Register>(addr))
    return getIfExists(p);
  if (auto p = dyc<MemoryAddr>(addr)) {
    auto reg1 = dyc<Register>(p->getReg1());
    reg1 = reg1 ? getIfExists(reg1) : p->getReg1();
    auto reg2 = dyc<Register>(p->getReg2());
    reg2 = reg2 ? getIfExists(reg2) : p->getReg2();
    return std::make_shared<MemoryAddr>(reg1, reg2, p->getScale(),
                                        p->getNumber());
  }
  assert(false);
}